

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderScene.cpp
# Opt level: O0

void __thiscall
Assimp::Blender::Structure::Convert<Assimp::Blender::Tex>
          (Structure *this,Tex *dest,FileDatabase *db)

{
  element_type *this_00;
  int local_28;
  short local_22;
  int temp;
  short temp_short;
  FileDatabase *db_local;
  Tex *dest_local;
  Structure *this_local;
  
  local_22 = 0;
  _temp = db;
  db_local = (FileDatabase *)dest;
  dest_local = (Tex *)this;
  ReadField<1,short>(this,&local_22,"imaflag",db);
  *(int *)&db_local[4].reader.
           super___shared_ptr<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi = (int)local_22;
  local_28 = 0;
  ReadField<2,int>(this,&local_28,"type",_temp);
  *(int *)((long)&db_local[4].reader.
                  super___shared_ptr<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi + 4) = local_28;
  ReadFieldPtr<1,std::shared_ptr,Assimp::Blender::Image>
            (this,(shared_ptr<Assimp::Blender::Image> *)&db_local[4].entries,"*ima",_temp,false);
  this_00 = ::std::
            __shared_ptr_access<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&_temp->reader);
  StreamReader<true,_true>::IncPtr(this_00,this->size);
  return;
}

Assistant:

void Structure :: Convert<Tex> (
    Tex& dest,
    const FileDatabase& db
    ) const
{
    short temp_short = 0;
    ReadField<ErrorPolicy_Igno>(temp_short,"imaflag",db);
    dest.imaflag = static_cast<Assimp::Blender::Tex::ImageFlags>(temp_short);
    int temp = 0;
    ReadField<ErrorPolicy_Fail>(temp,"type",db);
    dest.type = static_cast<Assimp::Blender::Tex::Type>(temp);
    ReadFieldPtr<ErrorPolicy_Warn>(dest.ima,"*ima",db);

    db.reader->IncPtr(size);
}